

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O0

int ps_end_utt(ps_decoder_t *ps)

{
  int32 iVar1;
  int32 iVar2;
  char *pcVar3;
  int iVar4;
  logmath_t *lmath;
  undefined4 uVar6;
  undefined8 uVar5;
  undefined4 uVar8;
  undefined8 uVar7;
  undefined4 uVar10;
  undefined8 uVar9;
  undefined4 uVar12;
  undefined8 uVar11;
  int32 local_68;
  int32 local_64;
  int32 lback;
  int32 ascr;
  int32 lscr;
  int32 post;
  int ef;
  int sf;
  char *word;
  ps_seg_t *ppStack_40;
  int32 score;
  ps_seg_t *seg;
  char *hyp;
  int i;
  int rv;
  ps_decoder_t *ps_local;
  
  _i = ps;
  if (ps->search == (ps_search_t *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
            ,0x51b,
            "No search module is selected, did you forget to specify a language model or grammar?\n"
           );
    ps_local._4_4_ = -1;
  }
  else if ((ps->acmod->state == '\x03') || (ps->acmod->state == '\0')) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
            ,0x51f,"Utterance is not started\n");
    ps_local._4_4_ = -1;
  }
  else {
    acmod_end_utt(ps->acmod);
    hyp._4_4_ = ps_search_forward(_i);
    if (hyp._4_4_ < 0) {
      ptmr_stop(&_i->perf);
      ps_local._4_4_ = hyp._4_4_;
    }
    else if ((_i->phone_loop == (ps_search_t *)0x0) ||
            (hyp._4_4_ = (*_i->phone_loop->vt->finish)(_i->phone_loop), -1 < hyp._4_4_)) {
      if (_i->pl_window <= _i->acmod->output_frame) {
        for (hyp._0_4_ = _i->acmod->output_frame - _i->pl_window; (int)hyp < _i->acmod->output_frame
            ; hyp._0_4_ = (int)hyp + 1) {
          (*_i->search->vt->step)(_i->search,(int)hyp);
        }
      }
      hyp._4_4_ = (*_i->search->vt->finish)(_i->search);
      if (hyp._4_4_ < 0) {
        ptmr_stop(&_i->perf);
        ps_local._4_4_ = hyp._4_4_;
      }
      else {
        ptmr_stop(&_i->perf);
        iVar4 = ps_config_bool(_i->config,"backtrace");
        if ((iVar4 != 0) &&
           (seg = (ps_seg_t *)ps_get_hyp(_i,(int32 *)((long)&word + 4)), seg != (ps_seg_t *)0x0)) {
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
                  ,0x546,"%s (%d)\n",seg,(ulong)word._4_4_);
          uVar5 = 0;
          uVar7 = 0;
          uVar9 = 0;
          uVar11 = 0;
          err_msg(ERR_INFO,(char *)0x0,0,"%-20s %-5s %-5s %-5s %-10s %-10s %-3s\n","word","start",
                  "end","pprob","ascr","lscr","lback");
          ppStack_40 = ps_seg_iter(_i);
          while( true ) {
            uVar12 = (undefined4)((ulong)uVar11 >> 0x20);
            uVar10 = (undefined4)((ulong)uVar9 >> 0x20);
            uVar8 = (undefined4)((ulong)uVar7 >> 0x20);
            uVar6 = (undefined4)((ulong)uVar5 >> 0x20);
            if (ppStack_40 == (ps_seg_t *)0x0) break;
            _ef = ps_seg_word(ppStack_40);
            ps_seg_frames(ppStack_40,&post,&lscr);
            ascr = ps_seg_prob(ppStack_40,&local_64,&lback,&local_68);
            pcVar3 = _ef;
            iVar2 = post;
            iVar1 = lscr;
            lmath = ps_get_logmath(_i);
            logmath_exp(lmath,ascr);
            uVar5 = CONCAT44(uVar6,iVar1);
            uVar7 = CONCAT44(uVar8,local_64);
            uVar9 = CONCAT44(uVar10,lback);
            uVar11 = CONCAT44(uVar12,local_68);
            err_msg(ERR_INFO,(char *)0x0,0,"%-20s %-5d %-5d %-1.3f %-10d %-10d %-3d\n",pcVar3,
                    (ulong)(uint)iVar2,uVar5,uVar7,uVar9,uVar11);
            ppStack_40 = ps_seg_next(ppStack_40);
          }
        }
        ps_local._4_4_ = hyp._4_4_;
      }
    }
    else {
      ptmr_stop(&_i->perf);
      ps_local._4_4_ = hyp._4_4_;
    }
  }
  return ps_local._4_4_;
}

Assistant:

int
ps_end_utt(ps_decoder_t *ps)
{
    int rv, i;

    if (ps->search == NULL) {
        E_ERROR("No search module is selected, did you forget to "
                "specify a language model or grammar?\n");
        return -1;
    }
    if (ps->acmod->state == ACMOD_ENDED || ps->acmod->state == ACMOD_IDLE) {
	E_ERROR("Utterance is not started\n");
	return -1;
    }
    acmod_end_utt(ps->acmod);

    /* Search any remaining frames. */
    if ((rv = ps_search_forward(ps)) < 0) {
        ptmr_stop(&ps->perf);
        return rv;
    }
    /* Finish phone loop search. */
    if (ps->phone_loop) {
        if ((rv = ps_search_finish(ps->phone_loop)) < 0) {
            ptmr_stop(&ps->perf);
            return rv;
        }
    }
    /* Search any frames remaining in the lookahead window. */
    if (ps->acmod->output_frame >= ps->pl_window) {
        for (i = ps->acmod->output_frame - ps->pl_window;
             i < ps->acmod->output_frame; ++i)
            ps_search_step(ps->search, i);
    }
    /* Finish main search. */
    if ((rv = ps_search_finish(ps->search)) < 0) {
        ptmr_stop(&ps->perf);
        return rv;
    }
    ptmr_stop(&ps->perf);

    /* Log a backtrace if requested. */
    if (ps_config_bool(ps->config, "backtrace")) {
        const char* hyp;
        ps_seg_t *seg;
        int32 score;

        hyp = ps_get_hyp(ps, &score);
        
        if (hyp != NULL) {
    	    E_INFO("%s (%d)\n", hyp, score);
    	    E_INFO_NOFN("%-20s %-5s %-5s %-5s %-10s %-10s %-3s\n",
                    "word", "start", "end", "pprob", "ascr", "lscr", "lback");
    	    for (seg = ps_seg_iter(ps); seg;
        	 seg = ps_seg_next(seg)) {
    	        char const *word;
        	int sf, ef;
        	int32 post, lscr, ascr, lback;

        	word = ps_seg_word(seg);
        	ps_seg_frames(seg, &sf, &ef);
        	post = ps_seg_prob(seg, &ascr, &lscr, &lback);
        	E_INFO_NOFN("%-20s %-5d %-5d %-1.3f %-10d %-10d %-3d\n",
                    	    word, sf, ef, logmath_exp(ps_get_logmath(ps), post),
                    	ascr, lscr, lback);
    	    }
        }
    }
    return rv;
}